

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

Float __thiscall
pbrt::TrowbridgeReitzDistribution::Lambda(TrowbridgeReitzDistribution *this,Vector3f *w)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  
  fVar10 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar10 = fVar10 * fVar10;
  auVar9 = ZEXT816(0) << 0x40;
  auVar11 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar10)),auVar9);
  fVar7 = auVar11._0_4_;
  fVar10 = fVar7 / fVar10;
  if (ABS(fVar10) != INFINITY) {
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar7 = auVar11._0_4_;
    }
    fVar3 = 1.0;
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      auVar9 = ZEXT416((uint)((w->super_Tuple3<pbrt::Vector3,_float>).x / fVar7));
      auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
      uVar1 = vcmpss_avx512f(auVar9,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar2 = (bool)((byte)uVar1 & 1);
      fVar3 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar11._0_4_);
    }
    fVar7 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar11._0_12_ = ZEXT812(0);
    auVar11._12_4_ = 0;
    auVar11 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar7 * fVar7)),auVar11);
    if (auVar11._0_4_ < 0.0) {
      fVar7 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar7 = auVar11._0_4_;
    }
    fVar4 = 1.0;
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      auVar9 = ZEXT416((uint)((w->super_Tuple3<pbrt::Vector3,_float>).x / fVar7));
      auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
      uVar1 = vcmpss_avx512f(auVar9,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar2 = (bool)((byte)uVar1 & 1);
      fVar4 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar11._0_4_);
    }
    fVar7 = this->alpha_x;
    fVar8 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar11 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar8 * fVar8)),ZEXT816(0) << 0x40);
    if (auVar11._0_4_ < 0.0) {
      fVar8 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar8 = auVar11._0_4_;
    }
    fVar5 = 0.0;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      auVar9 = ZEXT416((uint)((w->super_Tuple3<pbrt::Vector3,_float>).y / fVar8));
      auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
      uVar1 = vcmpss_avx512f(auVar9,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar2 = (bool)((byte)uVar1 & 1);
      fVar5 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar11._0_4_);
    }
    fVar8 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar11 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar8 * fVar8)),ZEXT816(0) << 0x40);
    if (auVar11._0_4_ < 0.0) {
      fVar8 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar8 = auVar11._0_4_;
    }
    fVar6 = 0.0;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      auVar9 = ZEXT416((uint)((w->super_Tuple3<pbrt::Vector3,_float>).y / fVar8));
      auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
      uVar1 = vcmpss_avx512f(auVar9,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar2 = (bool)((byte)uVar1 & 1);
      fVar6 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar11._0_4_);
    }
    auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar7 * fVar7)),ZEXT416((uint)(fVar3 * fVar4)),
                              ZEXT416((uint)(fVar5 * fVar6 * this->alpha_y * this->alpha_y)));
    auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar10),auVar11,ZEXT416(0x3f800000));
    if (auVar11._0_4_ < 0.0) {
      fVar10 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar10 = auVar11._0_4_;
    }
    auVar9 = ZEXT416((uint)((fVar10 + -1.0) * 0.5));
  }
  return auVar9._0_4_;
}

Assistant:

PBRT_CPU_GPU
inline Float Cos2Theta(const Vector3f &w) {
    return w.z * w.z;
}